

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

string * cmTargetPropertyComputer::ComputeLocation<cmTarget>(cmTarget *tgt,string *config)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmGlobalGenerator *this;
  cmGeneratorTarget *this_00;
  string local_38;
  
  if (ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_ == '\0'
     ) {
    ComputeLocation<cmTarget>();
  }
  _Var1._M_head_impl =
       (tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->IsImportedTarget == true) {
    cmTarget::ImportedGetFullPath(&local_38,tgt,config,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&local_38);
  }
  else {
    this = cmMakefile::GetGlobalGenerator((_Var1._M_head_impl)->Makefile);
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
    }
    this_00 = cmGlobalGenerator::FindGeneratorTarget
                        (this,&((tgt->impl)._M_t.
                                super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                               Name);
    cmGeneratorTarget::GetFullPath(&local_38,this_00,config,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_;
}

Assistant:

const std::string& cmTargetPropertyComputer::ComputeLocation<cmTarget>(
  cmTarget const* tgt, const std::string& config)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc =
      tgt->ImportedGetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
    return loc;
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  return loc;
}